

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

int Kit_DsdCofactoring(uint *pTruth,int nVars,int *pCofVars,int nLimit,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Kit_DsdNtk_t *pKVar5;
  Kit_DsdNtk_t *pKVar6;
  int local_5b4;
  int local_5b0;
  int local_5a8;
  int nMemSize;
  int nSize;
  int nStep;
  int v;
  int k;
  int i;
  int iVarBest;
  int nSuppSizeMax;
  int nSuppSizeMin;
  int nPrimeSizeCur;
  int nPrimeSizeMax;
  int nPrimeSizeMin;
  int nTryVars;
  int pTryVars [16];
  uint *ppCofs [5] [16];
  Kit_DsdNtk_t *pTemp;
  Kit_DsdNtk_t *ppNtks [5] [16];
  int fVerbose_local;
  int nLimit_local;
  int *pCofVars_local;
  int nVars_local;
  uint *pTruth_local;
  
  ppNtks[4][0xf]._0_4_ = fVerbose;
  ppNtks[4][0xf]._4_4_ = nLimit;
  memset(&pTemp,0,0x280);
  if (4 < ppNtks[4][0xf]._4_4_) {
    __assert_fail("nLimit < 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/kit/kitDsd.c"
                  ,0xa86,"int Kit_DsdCofactoring(unsigned int *, int, int *, int, int)");
  }
  iVar1 = Kit_TruthWordNum(nVars);
  pTryVars._56_8_ = malloc((long)(iVar1 * 0x50) << 2);
  local_5a8 = 0;
  for (v = 0; v < 5; v = v + 1) {
    for (nStep = 0; nStep < 0x10; nStep = nStep + 1) {
      ppCofs[(long)v + -1][(long)nStep + 0xf] =
           (uint *)(pTryVars._56_8_ + (long)(iVar1 * local_5a8) * 4);
      local_5a8 = local_5a8 + 1;
    }
  }
  if (local_5a8 != 0x50) {
    __assert_fail("nSize == 80",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/kit/kitDsd.c"
                  ,0xa8f,"int Kit_DsdCofactoring(unsigned int *, int, int *, int, int)");
  }
  Kit_TruthCopy((uint *)pTryVars._56_8_,pTruth,nVars);
  pTemp = Kit_DsdDecompose((uint *)pTryVars._56_8_,nVars);
  if ((int)ppNtks[4][0xf] != 0) {
    printf("\nProcessing prime function with %d support variables:\n",(ulong)(uint)nVars);
  }
  for (nMemSize = 0; nMemSize < ppNtks[4][0xf]._4_4_; nMemSize = nMemSize + 1) {
    iVar1 = 1 << ((byte)nMemSize & 0x1f);
    iVar2 = Kit_DsdCofactoringGetVars(ppNtks[(long)nMemSize + -1] + 0xf,iVar1,&nPrimeSizeMin);
    if (iVar2 == 0) break;
    k = -1;
    nPrimeSizeCur = 10000;
    iVarBest = 10000;
    for (nSize = 0; nSize < iVar2; nSize = nSize + 1) {
      nSuppSizeMin = 0;
      i = 0;
      for (v = 0; v < iVar1; v = v + 1) {
        Kit_TruthCofactor0New
                  (ppCofs[(long)(nMemSize + 1) + -1][(long)(v << 1) + 0xf],
                   ppCofs[(long)nMemSize + -1][(long)v + 0xf],nVars,(&nPrimeSizeMin)[nSize]);
        Kit_TruthCofactor1New
                  (ppCofs[(long)(nMemSize + 1) + -1][(long)(v * 2 + 1) + 0xf],
                   ppCofs[(long)nMemSize + -1][(long)v + 0xf],nVars,(&nPrimeSizeMin)[nSize]);
        pKVar5 = Kit_DsdDecompose(ppCofs[(long)(nMemSize + 1) + -1][(long)(v << 1) + 0xf],nVars);
        ppNtks[(long)(nMemSize + 1) + -1][(long)(v << 1) + 0xf] = pKVar5;
        pKVar5 = Kit_DsdDecompose(ppCofs[(long)(nMemSize + 1) + -1][(long)(v * 2 + 1) + 0xf],nVars);
        ppNtks[(long)(nMemSize + 1) + -1][(long)(v * 2 + 1) + 0xf] = pKVar5;
        local_5b0 = Kit_DsdNonDsdSizeMax(ppNtks[(long)(nMemSize + 1) + -1][(long)(v << 1) + 0xf]);
        if (local_5b0 < nSuppSizeMin) {
          local_5b0 = nSuppSizeMin;
        }
        local_5b4 = Kit_DsdNonDsdSizeMax(ppNtks[(long)(nMemSize + 1) + -1][(long)(v * 2 + 1) + 0xf])
        ;
        if (local_5b4 < local_5b0) {
          local_5b4 = local_5b0;
        }
        nSuppSizeMin = local_5b4;
        iVar3 = Kit_TruthSupportSize(ppCofs[(long)(nMemSize + 1) + -1][(long)(v << 1) + 0xf],nVars);
        iVar4 = Kit_TruthSupportSize
                          (ppCofs[(long)(nMemSize + 1) + -1][(long)(v * 2 + 1) + 0xf],nVars);
        i = iVar4 + iVar3 + i;
        Kit_DsdNtkFree(ppNtks[(long)(nMemSize + 1) + -1][(long)(v << 1) + 0xf]);
        Kit_DsdNtkFree(ppNtks[(long)(nMemSize + 1) + -1][(long)(v * 2 + 1) + 0xf]);
      }
      if ((nSuppSizeMin < nPrimeSizeCur) || ((nPrimeSizeCur == nSuppSizeMin && (i < iVarBest)))) {
        nPrimeSizeCur = nSuppSizeMin;
        iVarBest = i;
        k = (&nPrimeSizeMin)[nSize];
      }
    }
    if (k == -1) {
      __assert_fail("iVarBest != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/kit/kitDsd.c"
                    ,0xac3,"int Kit_DsdCofactoring(unsigned int *, int, int *, int, int)");
    }
    if (pCofVars != (int *)0x0) {
      pCofVars[nMemSize] = k;
    }
    for (v = 0; v < iVar1; v = v + 1) {
      Kit_TruthCofactor0New
                (ppCofs[(long)(nMemSize + 1) + -1][(long)(v << 1) + 0xf],
                 ppCofs[(long)nMemSize + -1][(long)v + 0xf],nVars,k);
      Kit_TruthCofactor1New
                (ppCofs[(long)(nMemSize + 1) + -1][(long)(v * 2 + 1) + 0xf],
                 ppCofs[(long)nMemSize + -1][(long)v + 0xf],nVars,k);
      pKVar5 = Kit_DsdDecompose(ppCofs[(long)(nMemSize + 1) + -1][(long)(v << 1) + 0xf],nVars);
      ppNtks[(long)(nMemSize + 1) + -1][(long)(v << 1) + 0xf] = pKVar5;
      pKVar5 = Kit_DsdDecompose(ppCofs[(long)(nMemSize + 1) + -1][(long)(v * 2 + 1) + 0xf],nVars);
      ppNtks[(long)(nMemSize + 1) + -1][(long)(v * 2 + 1) + 0xf] = pKVar5;
      if ((int)ppNtks[4][0xf] != 0) {
        pKVar5 = ppNtks[(long)(nMemSize + 1) + -1][(long)(v << 1) + 0xf];
        pKVar6 = Kit_DsdExpand(pKVar5);
        ppNtks[(long)(nMemSize + 1) + -1][(long)(v << 1) + 0xf] = pKVar6;
        Kit_DsdNtkFree(pKVar5);
        pKVar5 = ppNtks[(long)(nMemSize + 1) + -1][(long)(v * 2 + 1) + 0xf];
        pKVar6 = Kit_DsdExpand(pKVar5);
        ppNtks[(long)(nMemSize + 1) + -1][(long)(v * 2 + 1) + 0xf] = pKVar6;
        Kit_DsdNtkFree(pKVar5);
        printf("Cof%d%d: ",(ulong)(nMemSize + 1),(ulong)(uint)(v << 1));
        Kit_DsdPrint(_stdout,ppNtks[(long)(nMemSize + 1) + -1][(long)(v << 1) + 0xf]);
        printf("\n");
        printf("Cof%d%d: ",(ulong)(nMemSize + 1),(ulong)(v * 2 + 1));
        Kit_DsdPrint(_stdout,ppNtks[(long)(nMemSize + 1) + -1][(long)(v * 2 + 1) + 0xf]);
        printf("\n");
      }
    }
  }
  for (v = 0; v < 5; v = v + 1) {
    for (nStep = 0; nStep < 0x10; nStep = nStep + 1) {
      if (ppNtks[(long)v + -1][(long)nStep + 0xf] != (Kit_DsdNtk_t *)0x0) {
        Kit_DsdNtkFree(ppNtks[(long)v + -1][(long)nStep + 0xf]);
      }
    }
  }
  if (pTryVars._56_8_ != 0) {
    free((void *)pTryVars._56_8_);
    pTryVars[0xe] = 0;
    pTryVars[0xf] = 0;
  }
  if (ppNtks[4][0xf]._4_4_ < nMemSize) {
    __assert_fail("nStep <= nLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/kit/kitDsd.c"
                  ,0xae4,"int Kit_DsdCofactoring(unsigned int *, int, int *, int, int)");
  }
  return nMemSize;
}

Assistant:

int Kit_DsdCofactoring( unsigned * pTruth, int nVars, int * pCofVars, int nLimit, int fVerbose )
{
    Kit_DsdNtk_t * ppNtks[5][16] = {
      {0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0},
      {0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0},
      {0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0},
      {0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0},
      {0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0}
    };
    Kit_DsdNtk_t * pTemp;
    unsigned * ppCofs[5][16];
    int pTryVars[16], nTryVars;
    int nPrimeSizeMin, nPrimeSizeMax, nPrimeSizeCur;
    int nSuppSizeMin, nSuppSizeMax, iVarBest;
    int i, k, v, nStep, nSize, nMemSize;
    assert( nLimit < 5 );

    // allocate storage for cofactors
    nMemSize = Kit_TruthWordNum(nVars);
    ppCofs[0][0] = ABC_ALLOC( unsigned, 80 * nMemSize );
    nSize = 0;
    for ( i = 0; i <  5; i++ )
    for ( k = 0; k < 16; k++ )
        ppCofs[i][k] = ppCofs[0][0] + nMemSize * nSize++;
    assert( nSize == 80 );

    // copy the function
    Kit_TruthCopy( ppCofs[0][0], pTruth, nVars );
    ppNtks[0][0] = Kit_DsdDecompose( ppCofs[0][0], nVars );

    if ( fVerbose )
        printf( "\nProcessing prime function with %d support variables:\n", nVars );

    // perform recursive cofactoring
    for ( nStep = 0; nStep < nLimit; nStep++ )
    {
        nSize = (1 << nStep);
        // find the variables to use in the cofactoring step
        nTryVars = Kit_DsdCofactoringGetVars( ppNtks[nStep], nSize, pTryVars );
        if ( nTryVars == 0 )
            break;
        // cofactor w.r.t. the above variables
        iVarBest = -1;
        nPrimeSizeMin = 10000;
        nSuppSizeMin  = 10000;
        for ( v = 0; v < nTryVars; v++ )
        {
            nPrimeSizeMax = 0;
            nSuppSizeMax = 0;
            for ( i = 0; i < nSize; i++ )
            {
                // cofactor and decompose cofactors          
                Kit_TruthCofactor0New( ppCofs[nStep+1][2*i+0], ppCofs[nStep][i], nVars, pTryVars[v] );
                Kit_TruthCofactor1New( ppCofs[nStep+1][2*i+1], ppCofs[nStep][i], nVars, pTryVars[v] );
                ppNtks[nStep+1][2*i+0] = Kit_DsdDecompose( ppCofs[nStep+1][2*i+0], nVars );
                ppNtks[nStep+1][2*i+1] = Kit_DsdDecompose( ppCofs[nStep+1][2*i+1], nVars );
                // compute the largest non-decomp block
                nPrimeSizeCur  = Kit_DsdNonDsdSizeMax(ppNtks[nStep+1][2*i+0]);
                nPrimeSizeMax  = KIT_MAX( nPrimeSizeMax, nPrimeSizeCur );
                nPrimeSizeCur  = Kit_DsdNonDsdSizeMax(ppNtks[nStep+1][2*i+1]);
                nPrimeSizeMax  = KIT_MAX( nPrimeSizeMax, nPrimeSizeCur );
                // compute the sum total of supports
                nSuppSizeMax += Kit_TruthSupportSize( ppCofs[nStep+1][2*i+0], nVars );
                nSuppSizeMax += Kit_TruthSupportSize( ppCofs[nStep+1][2*i+1], nVars );
                // free the networks
                Kit_DsdNtkFree( ppNtks[nStep+1][2*i+0] );
                Kit_DsdNtkFree( ppNtks[nStep+1][2*i+1] );
            }
            // find the min max support size of the prime component
            if ( nPrimeSizeMin > nPrimeSizeMax || (nPrimeSizeMin == nPrimeSizeMax && nSuppSizeMin > nSuppSizeMax) )
            {
                nPrimeSizeMin = nPrimeSizeMax;
                nSuppSizeMin  = nSuppSizeMax;
                iVarBest      = pTryVars[v];
            }
        }
        assert( iVarBest != -1 );
        // save the variable
        if ( pCofVars )
            pCofVars[nStep] = iVarBest;
        // cofactor w.r.t. the best
        for ( i = 0; i < nSize; i++ )
        {
            Kit_TruthCofactor0New( ppCofs[nStep+1][2*i+0], ppCofs[nStep][i], nVars, iVarBest );
            Kit_TruthCofactor1New( ppCofs[nStep+1][2*i+1], ppCofs[nStep][i], nVars, iVarBest );
            ppNtks[nStep+1][2*i+0] = Kit_DsdDecompose( ppCofs[nStep+1][2*i+0], nVars );
            ppNtks[nStep+1][2*i+1] = Kit_DsdDecompose( ppCofs[nStep+1][2*i+1], nVars );
            if ( fVerbose )
            {
                ppNtks[nStep+1][2*i+0] = Kit_DsdExpand( pTemp = ppNtks[nStep+1][2*i+0] );
                Kit_DsdNtkFree( pTemp );
                ppNtks[nStep+1][2*i+1] = Kit_DsdExpand( pTemp = ppNtks[nStep+1][2*i+1] );
                Kit_DsdNtkFree( pTemp );

                printf( "Cof%d%d: ", nStep+1, 2*i+0 );
                Kit_DsdPrint( stdout, ppNtks[nStep+1][2*i+0] ), printf( "\n" );
                printf( "Cof%d%d: ", nStep+1, 2*i+1 );
                Kit_DsdPrint( stdout, ppNtks[nStep+1][2*i+1] ), printf( "\n" );
            }
        }
    }

    // free the networks
    for ( i = 0; i <  5; i++ )
    for ( k = 0; k < 16; k++ )
        if ( ppNtks[i][k] )
            Kit_DsdNtkFree( ppNtks[i][k] );
    ABC_FREE( ppCofs[0][0] );

    assert( nStep <= nLimit );
    return nStep;
}